

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join6.c
# Opt level: O0

int run_test_udp_multicast_join6(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *puVar3;
  undefined1 local_2c [8];
  sockaddr_in6 addr;
  int r;
  
  iVar1 = can_ipv6_external();
  if (iVar1 == 0) {
    fprintf(_stderr,"%s\n","No external IPv6 interface available");
    fflush(_stderr);
    addr.sin6_scope_id = 1;
  }
  else {
    iVar1 = uv_ip6_addr("::",0x23a3,local_2c);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join6.c"
              ,0xb0,"0 == uv_ip6_addr(\"::\", TEST_PORT, &addr)");
      abort();
    }
    uVar2 = uv_default_loop();
    addr.sin6_addr.__in6_u.__u6_addr32[3] = uv_udp_init(uVar2,&server);
    if (addr.sin6_addr.__in6_u.__u6_addr32[3] != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join6.c"
              ,0xb3,"r == 0");
      abort();
    }
    uVar2 = uv_default_loop();
    addr.sin6_addr.__in6_u.__u6_addr32[3] = uv_udp_init(uVar2,&client);
    if (addr.sin6_addr.__in6_u.__u6_addr32[3] != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join6.c"
              ,0xb6,"r == 0");
      abort();
    }
    addr.sin6_addr.__in6_u.__u6_addr32[3] = uv_udp_bind(&server,local_2c,0);
    if (addr.sin6_addr.__in6_u.__u6_addr32[3] != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join6.c"
              ,0xba,"r == 0");
      abort();
    }
    addr.sin6_addr.__in6_u.__u6_addr32[3] = uv_udp_set_membership(&server,"ff02::1",0,1);
    if (addr.sin6_addr.__in6_u.__u6_addr32[3] == 0xffffffed) {
      puVar3 = (uv_loop_t *)uv_default_loop();
      close_loop(puVar3);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join6.c"
                ,0xbe,"0 == uv_loop_close(uv_default_loop())");
        abort();
      }
      uv_library_shutdown();
      fprintf(_stderr,"%s\n","No ipv6 multicast route");
      fflush(_stderr);
      addr.sin6_scope_id = 1;
    }
    else {
      if (addr.sin6_addr.__in6_u.__u6_addr32[3] != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join6.c"
                ,0xc2,"r == 0");
        abort();
      }
      addr.sin6_addr.__in6_u.__u6_addr32[3] = uv_udp_recv_start(&server,alloc_cb,cl_recv_cb);
      if (addr.sin6_addr.__in6_u.__u6_addr32[3] != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join6.c"
                ,0xc9,"r == 0");
        abort();
      }
      addr.sin6_addr.__in6_u.__u6_addr32[3] = do_send(&req);
      if (addr.sin6_addr.__in6_u.__u6_addr32[3] != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join6.c"
                ,0xcc,"r == 0");
        abort();
      }
      if (close_cb_called != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join6.c"
                ,0xce,"close_cb_called == 0");
        abort();
      }
      if (cl_recv_cb_called != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join6.c"
                ,0xcf,"cl_recv_cb_called == 0");
        abort();
      }
      if (sv_send_cb_called != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join6.c"
                ,0xd0,"sv_send_cb_called == 0");
        abort();
      }
      uVar2 = uv_default_loop();
      uv_run(uVar2,0);
      if (cl_recv_cb_called != 2) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join6.c"
                ,0xd5,"cl_recv_cb_called == 2");
        abort();
      }
      if (sv_send_cb_called != 2) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join6.c"
                ,0xd6,"sv_send_cb_called == 2");
        abort();
      }
      if (close_cb_called != 2) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join6.c"
                ,0xd7,"close_cb_called == 2");
        abort();
      }
      puVar3 = (uv_loop_t *)uv_default_loop();
      close_loop(puVar3);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join6.c"
                ,0xd9,"0 == uv_loop_close(uv_default_loop())");
        abort();
      }
      uv_library_shutdown();
      addr.sin6_scope_id = 0;
    }
  }
  return addr.sin6_scope_id;
}

Assistant:

TEST_IMPL(udp_multicast_join6) {
  int r;
  struct sockaddr_in6 addr;

  if (!can_ipv6_external())
    RETURN_SKIP("No external IPv6 interface available");

  ASSERT(0 == uv_ip6_addr("::", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  /* bind to the desired port */
  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_set_membership(&server, MULTICAST_ADDR, INTERFACE_ADDR, UV_JOIN_GROUP);
  if (r == UV_ENODEV) {
    MAKE_VALGRIND_HAPPY();
    RETURN_SKIP("No ipv6 multicast route");
  }

  ASSERT(r == 0);

/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
  r = uv_udp_recv_start(&server, alloc_cb, cl_recv_cb);
  ASSERT(r == 0);
  
  r = do_send(&req);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(cl_recv_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(cl_recv_cb_called == 2);
  ASSERT(sv_send_cb_called == 2);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}